

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchMan.c
# Opt level: O2

Dch_Man_t * Dch_ManCreate(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  Dch_Man_t *pDVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t **ppAVar4;
  
  pDVar1 = (Dch_Man_t *)calloc(1,0xe0);
  pDVar1->pPars = pPars;
  pDVar1->pAigTotal = pAig;
  Aig_ManFanoutStart(pAig);
  pDVar1->nSatVars = 1;
  piVar2 = (int *)calloc((long)pAig->vObjs->nSize,4);
  pDVar1->pSatVars = piVar2;
  pVVar3 = Vec_PtrAlloc(1000);
  pDVar1->vUsedNodes = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  pDVar1->vFanins = pVVar3;
  pVVar3 = Vec_PtrAlloc(1000);
  pDVar1->vSimRoots = pVVar3;
  pVVar3 = Vec_PtrAlloc(1000);
  pDVar1->vSimClasses = pVVar3;
  ppAVar4 = (Aig_Obj_t **)calloc((long)pAig->vObjs->nSize,8);
  pDVar1->pReprsProved = ppAVar4;
  return pDVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Dch_Man_t * Dch_ManCreate( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
    Dch_Man_t * p;
    // create interpolation manager
    p = ABC_ALLOC( Dch_Man_t, 1 );
    memset( p, 0, sizeof(Dch_Man_t) );
    p->pPars        = pPars;
    p->pAigTotal    = pAig; //Dch_DeriveTotalAig( vAigs );
    Aig_ManFanoutStart( p->pAigTotal );
    // SAT solving
    p->nSatVars     = 1;
    p->pSatVars     = ABC_CALLOC( int, Aig_ManObjNumMax(p->pAigTotal) );
    p->vUsedNodes   = Vec_PtrAlloc( 1000 );
    p->vFanins      = Vec_PtrAlloc( 100 );
    p->vSimRoots    = Vec_PtrAlloc( 1000 );
    p->vSimClasses  = Vec_PtrAlloc( 1000 );
    // equivalences proved
    p->pReprsProved = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAigTotal) );
    return p;
}